

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool set_voice(OpenJTalk *oj,char *path)

{
  char *__src;
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  uint *pc;
  uint *wildcard;
  uint c;
  char temp [260];
  char name_extended [260];
  uint local_23c;
  char local_238 [272];
  uint local_128 [66];
  
  if (oj == (OpenJTalk *)0x0) {
    return false;
  }
  memset(local_238,0,0x104);
  if ((path == (char *)0x0) || (*path == '\0')) {
    if (oj->dn_voice_dir_path[0] == '\0') goto LAB_0013f012;
    local_128[0] = 0;
    _Var1 = search_file_recursive(oj->dn_voice_dir_path,G_VOICE_DEFAULT,local_238,local_128,200);
    if (!_Var1) {
      pc = local_128;
      local_128[0] = 0;
      wildcard = (uint *)G_VOICE_WILDCARD;
      goto LAB_0013ef53;
    }
LAB_0013efef:
    strcpy(oj->fn_voice_path,local_238);
    Open_JTalk_load_voice(oj->open_jtalk,local_238);
    _Var1 = true;
  }
  else {
    _Var1 = is_name_only(path);
    if (_Var1) {
      sVar2 = strlen(path);
      __src = G_VOICE_EXT;
      sVar3 = strlen(G_VOICE_EXT);
      if ((sVar3 + sVar2) - 0x104 < 0xfffffffffffffefb) goto LAB_0013f012;
      strcpy((char *)local_128,path);
      strcat((char *)local_128,__src);
      pc = &local_23c;
      local_23c = 0;
      wildcard = local_128;
LAB_0013ef53:
      _Var1 = search_file_recursive(oj->dn_voice_dir_path,(char *)wildcard,local_238,pc,200);
LAB_0013efeb:
      if (_Var1 != false) goto LAB_0013efef;
    }
    else {
      _Var1 = is_relative(path);
      if (!_Var1) {
        strcpy(local_238,path);
LAB_0013efe3:
        _Var1 = exists_file(local_238);
        goto LAB_0013efeb;
      }
      sVar2 = strlen(g_current_path);
      if (sVar2 != 0) {
        sVar3 = strlen(path);
        if (0xfffffffffffffefa < (sVar3 + sVar2) - 0x103) {
          strcpy(local_238,g_current_path);
          strcat(local_238,G_SLASH_CHAR);
          strcat(local_238,path);
          goto LAB_0013efe3;
        }
      }
    }
LAB_0013f012:
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool set_voice(OpenJTalk *oj, const char *path)
{
	if (!oj)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	// パスが指定されていないとき、
	if (path == NULL || strlen(path) == 0)
	{
		// 音響モデルファイルフォルダが確定されていれば
		if (oj->dn_voice_dir_path != NULL && strlen(oj->dn_voice_dir_path) != 0)
		{
			// 標準名の音響モデルファイルを探す
			unsigned int c = 0;
			if (search_file_recursive(oj->dn_voice_dir_path, G_VOICE_DEFAULT, temp, &c, VOICESEARCHMAX))
			{
				goto return_true;
			}

			// 無ければ、何か音響モデルファイルを探す
			c = 0;
			if (search_file_recursive(oj->dn_voice_dir_path, G_VOICE_WILDCARD, temp, &c, VOICESEARCHMAX))
			{
				goto return_true;
			}
		}

		// パスが指定されていないとき、決まらなければ、偽を返す
		return false;
	}
	// パスが指定されているとき
	else
	{
		// 名前のみの表記の場合、
		if (is_name_only(path))
		{
			if (strlen(path) + strlen(G_VOICE_EXT) + 1 > MAX_PATH)
			{
				return false;
			}

			// dirが確定していれば
			char name_extended[MAX_PATH];
			strcat(strcpy(name_extended, path), G_VOICE_EXT);
			unsigned int c = 0;
			if (search_file_recursive(oj->dn_voice_dir_path, name_extended, temp, &c, VOICESEARCHMAX))
			{
				goto return_true;
			}
			return false;
		}

		// 相対指定の場合、
		if (is_relative(path))
		{
			if (g_current_path != NULL && strlen(g_current_path) != 0)
			{
				if (strlen(g_current_path) + 1 + strlen(path) + 1 > MAX_PATH)
				{
					return false;
				}

				strcpy(temp, g_current_path);
				strcat(temp, G_SLASH_CHAR);
				strcat(temp, path);

				if (exists_file(temp))
				{
					goto return_true;
				}
			}
		}
		// 絶対指定の場合、
		else
		{
			strcpy(temp, path);
			if (exists_file(temp))
			{
				goto return_true;
			}
		}
	}
	return false;

return_true:
	strcpy(oj->fn_voice_path, temp);
#if defined(_WIN32)
	char temp2[MAX_PATH];
	clear_path_string(temp2, MAX_PATH);
	u8tosjis_path(temp, temp2);
	Open_JTalk_load_voice(oj->open_jtalk, temp2);
#else
	Open_JTalk_load_voice(oj->open_jtalk, temp);
#endif
	return true;
}